

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v7::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char buf [7];
  char local_30 [8];
  
  uVar4 = s.size_;
  pcVar5 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_00691ac8;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar2 = pcVar5;
  if (3 < uVar4) {
    for (; pcVar2 < pcVar5 + (uVar4 - 3);
        pcVar2 = utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)this,pcVar2)) {
    }
  }
  pcVar5 = pcVar5 + (uVar4 - (long)pcVar2);
  if (pcVar5 != (char *)0x0) {
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[0] = '\0';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    if ((long)pcVar5 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    memcpy(local_30,pcVar2,(size_t)pcVar5);
    pcVar2 = local_30;
    do {
      pcVar2 = utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)this,pcVar2);
    } while ((long)pcVar2 - (long)local_30 < (long)pcVar5);
  }
  sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
  uVar4 = sVar3 + 1;
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ < uVar4) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
    sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
    uVar4 = sVar3 + 1;
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  (this->buffer_).super_buffer<wchar_t>.size_ = uVar4;
  pwVar1[sVar3] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}